

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> * __thiscall
slang::ast::InterfacePortSymbol::getDeclaredRange(InterfacePortSymbol *this)

{
  undefined7 uVar1;
  bool bVar2;
  int iVar3;
  Scope *pSVar4;
  DeclaratorSyntax *pDVar5;
  reference ppVVar6;
  Compilation *dst;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  InterfacePortSymbol *in_RSI;
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *in_RDI;
  LookupLocation LVar7;
  EvaluatedDimension dim;
  VariableDimensionSyntax *dimSyntax;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *__range2;
  SmallVector<slang::ConstantRange,_4UL> buffer;
  ASTContext context;
  Scope *scope;
  SyntaxNode *syntax;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffe98;
  Symbol *in_stack_fffffffffffffea0;
  ASTContext *in_stack_fffffffffffffea8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  VariableDimensionSyntax *in_stack_ffffffffffffff18;
  __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
  local_d0 [3];
  SyntaxList<slang::syntax::VariableDimensionSyntax> *local_b8;
  SmallVectorBase<slang::ConstantRange> local_b0;
  bitmask<slang::ast::ASTFlags> local_78;
  Scope *local_70;
  uint32_t local_68;
  Scope *local_60;
  uint32_t local_58;
  Scope *local_18;
  SyntaxNode *local_10;
  
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
                     0x4680cf);
  if (bVar2) {
    (in_RDI->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_ptr =
         (in_RSI->range).
         super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
         ._M_payload._M_value._M_ptr;
    (in_RDI->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_extent._M_extent_value =
         (in_RSI->range).
         super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
         ._M_payload._M_value._M_extent._M_extent_value;
    uVar1 = *(undefined7 *)
             &(in_RSI->range).
              super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
              .field_0x11;
    (in_RDI->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_engaged = (in_RSI->range).
                 super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                 ._M_engaged;
    *(undefined7 *)
     &(in_RDI->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      field_0x11 = uVar1;
  }
  else {
    bVar2 = isInvalid(in_RSI);
    if (bVar2) {
      std::optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>::emplace<>
                ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
                 in_stack_fffffffffffffea0);
      (in_RDI->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_payload._M_value._M_ptr =
           (in_RSI->range).
           super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
           ._M_payload._M_value._M_ptr;
      (in_RDI->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_payload._M_value._M_extent._M_extent_value =
           (in_RSI->range).
           super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
           ._M_payload._M_value._M_extent._M_extent_value;
      uVar1 = *(undefined7 *)
               &(in_RSI->range).
                super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                .field_0x11;
      (in_RDI->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_engaged = (in_RSI->range).
                   super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                   ._M_engaged;
      *(undefined7 *)
       &(in_RDI->
        super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
        .field_0x11 = uVar1;
    }
    else {
      local_10 = Symbol::getSyntax(&in_RSI->super_Symbol);
      pSVar4 = Symbol::getParentScope(&in_RSI->super_Symbol);
      local_18 = pSVar4;
      LVar7 = LookupLocation::before(in_stack_fffffffffffffea0);
      local_70 = LVar7.scope;
      local_68 = LVar7.index;
      local_60 = local_70;
      local_58 = local_68;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_78,NonProcedural);
      LVar7.scope._7_1_ = in_stack_fffffffffffffebf;
      LVar7.scope._0_7_ = in_stack_fffffffffffffeb8;
      LVar7._8_8_ = pSVar4;
      ASTContext::ASTContext
                (in_stack_fffffffffffffea8,(Scope *)in_stack_fffffffffffffea0,LVar7,
                 in_stack_fffffffffffffeb0);
      SmallVector<slang::ConstantRange,_4UL>::SmallVector
                ((SmallVector<slang::ConstantRange,_4UL> *)0x4681f3);
      pDVar5 = slang::syntax::SyntaxNode::as<slang::syntax::DeclaratorSyntax>(local_10);
      local_b8 = &pDVar5->dimensions;
      local_d0[0]._M_current =
           (VariableDimensionSyntax **)
           std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::begin
                     (in_stack_fffffffffffffe98);
      std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::end
                ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                 in_stack_fffffffffffffea8);
      while( true ) {
        bVar2 = __gnu_cxx::
                operator==<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                          ((__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffea0,
                           (__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffe98);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        ppVVar6 = __gnu_cxx::
                  __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                  ::operator*(local_d0);
        ASTContext::evalDimension
                  ((ASTContext *)*ppVVar6,in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17,
                   (bool)in_stack_ffffffffffffff16);
        bVar2 = EvaluatedDimension::isRange((EvaluatedDimension *)&stack0xffffffffffffff00);
        if (!bVar2) {
          std::optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>::optional
                    (in_RDI);
          goto LAB_004683a7;
        }
        SmallVectorBase<slang::ConstantRange>::push_back
                  ((SmallVectorBase<slang::ConstantRange> *)in_stack_fffffffffffffea0,
                   (ConstantRange *)in_stack_fffffffffffffe98);
        __gnu_cxx::
        __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
        ::operator++(local_d0);
      }
      dst = Scope::getCompilation(local_18);
      iVar3 = SmallVectorBase<slang::ConstantRange>::copy(&local_b0,(EVP_PKEY_CTX *)dst,src);
      std::optional<std::span<slang::ConstantRange_const,18446744073709551615ul>>::operator=
                ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)dst,
                 (span<slang::ConstantRange,_18446744073709551615UL> *)CONCAT44(extraout_var,iVar3))
      ;
      (in_RDI->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_payload._M_value._M_ptr =
           (in_RSI->range).
           super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
           ._M_payload._M_value._M_ptr;
      (in_RDI->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_payload._M_value._M_extent._M_extent_value =
           (in_RSI->range).
           super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
           ._M_payload._M_value._M_extent._M_extent_value;
      uVar1 = *(undefined7 *)
               &(in_RSI->range).
                super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                .field_0x11;
      (in_RDI->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_engaged = (in_RSI->range).
                   super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                   ._M_engaged;
      *(undefined7 *)
       &(in_RDI->
        super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
        .field_0x11 = uVar1;
LAB_004683a7:
      SmallVector<slang::ConstantRange,_4UL>::~SmallVector
                ((SmallVector<slang::ConstantRange,_4UL> *)0x4683b4);
    }
  }
  return in_RDI;
}

Assistant:

std::optional<std::span<const ConstantRange>> InterfacePortSymbol::getDeclaredRange() const {
    if (range)
        return range;

    if (isInvalid()) {
        range.emplace();
        return range;
    }

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);

    SmallVector<ConstantRange, 4> buffer;
    for (auto dimSyntax : syntax->as<DeclaratorSyntax>().dimensions) {
        auto dim = context.evalDimension(*dimSyntax, /* requireRange */ true, /* isPacked */ false);
        if (!dim.isRange())
            return std::nullopt;

        buffer.push_back(dim.range);
    }

    range = buffer.copy(scope->getCompilation());
    return range;
}